

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::make_huff_table(jpeg_decoder *this,int index,huff_tables *pH)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint idx;
  int total_codesize;
  int bits_to_fetch;
  int num_extra_bits;
  int extra_bits;
  uint uStack_55c;
  bool has_extrabits;
  int currententry;
  int nextfreeentry;
  int lastp;
  int code_size;
  uint subtree;
  uint code;
  uint huffcode [258];
  byte local_138 [8];
  uint8 huffsize [258];
  uint local_2c;
  int si;
  int l;
  int i;
  int p;
  huff_tables *pH_local;
  int index_local;
  jpeg_decoder *this_local;
  
  pH->ac_table = this->m_huff_ac[index] != '\0';
  l = 0;
  for (local_2c = 1; iVar4 = l, (int)local_2c < 0x11; local_2c = local_2c + 1) {
    for (si = 1; si <= (int)(uint)this->m_huff_num[index][(int)local_2c]; si = si + 1) {
      if (0x100 < l) {
        stop_decoding(this,JPGD_DECODE_ERROR);
      }
      local_138[l] = (byte)local_2c;
      l = l + 1;
    }
  }
  if (l < 0x102) {
    local_138[l] = 0;
    code_size = 0;
    stack0xffffffffffffffd0 = (uint)local_138[0];
    l = 0;
    while (local_138[l] != 0) {
      while (local_138[l] == stack0xffffffffffffffd0) {
        if (0x100 < l) {
          stop_decoding(this,JPGD_DECODE_ERROR);
        }
        (&subtree)[l] = code_size;
        code_size = code_size + 1;
        l = l + 1;
      }
      code_size = code_size << 1;
      stack0xffffffffffffffd0 = stack0xffffffffffffffd0 + 1;
    }
    memset(pH->look_up,0,0x400);
    memset(pH->look_up2,0,0x400);
    memset(pH->tree,0,0x800);
    memset(pH->code_size,0,0x100);
    uStack_55c = 0xffffffff;
    l = 0;
    while( true ) {
      if (iVar4 <= l) {
        return;
      }
      bVar1 = this->m_huff_val[index][l];
      uVar5 = (uint)bVar1;
      uVar7 = (&subtree)[l];
      bVar2 = local_138[l];
      uVar6 = (uint)bVar2;
      if (0xff < uVar5) break;
      pH->code_size[(int)uVar5] = bVar2;
      if (uVar6 < 9) {
        code_size = uVar7 << (8 - bVar2 & 0x1f);
        for (local_2c = 1 << (8 - bVar2 & 0x1f); 0 < (int)local_2c; local_2c = local_2c + -1) {
          if (0xff < (uint)code_size) {
            stop_decoding(this,JPGD_DECODE_ERROR);
          }
          pH->look_up[(uint)code_size] = uVar5;
          bVar3 = false;
          bits_to_fetch = 0;
          uVar7 = uVar5 & 0xf;
          idx = uVar6;
          if (((bVar1 & 0xf) != 0) && (uVar6 + uVar7 < 9)) {
            bVar3 = true;
            bits_to_fetch =
                 (1 << (sbyte)uVar7) - 1U & (uint)code_size >> (8U - (char)(uVar6 + uVar7) & 0x1f);
            if (0x7fff < bits_to_fetch) {
              stop_decoding(this,JPGD_DECODE_ERROR);
            }
            idx = uVar7 + uVar6;
          }
          if (bVar3) {
            pH->look_up2[(uint)code_size] = uVar5 | 0x8000 | bits_to_fetch << 0x10 | idx << 8;
          }
          else {
            pH->look_up2[(uint)code_size] = uVar5 | idx << 8;
          }
          code_size = code_size + 1;
        }
      }
      else {
        uVar8 = uVar7 >> (bVar2 - 8 & 0x1f) & 0xff;
        extra_bits = pH->look_up[uVar8];
        if (extra_bits == 0) {
          pH->look_up[uVar8] = uStack_55c;
          extra_bits = uStack_55c;
          pH->look_up2[uVar8] = uStack_55c;
          uStack_55c = uStack_55c - 2;
        }
        code_size = uVar7 << (0x10 - (bVar2 - 8) & 0x1f);
        for (local_2c = uVar6; 9 < (int)local_2c; local_2c = local_2c - 1) {
          if ((code_size & 0x8000U) == 0) {
            extra_bits = extra_bits + -1;
          }
          uVar7 = 0xffffffff - extra_bits;
          if (0x1ff < uVar7) {
            stop_decoding(this,JPGD_DECODE_ERROR);
          }
          if (pH->tree[uVar7] == 0) {
            pH->tree[uVar7] = uStack_55c;
            extra_bits = uStack_55c;
            uStack_55c = uStack_55c - 2;
          }
          else {
            extra_bits = pH->tree[uVar7];
          }
          code_size = code_size << 1;
        }
        if ((code_size & 0x8000U) == 0) {
          extra_bits = extra_bits + -1;
        }
        if (0x1ff < -1 - extra_bits) {
          stop_decoding(this,JPGD_DECODE_ERROR);
        }
        pH->tree[-1 - extra_bits] = uVar5;
      }
      l = l + 1;
    }
    __assert_fail("i < JPGD_HUFF_CODE_SIZE_MAX_LENGTH",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                  ,0x922,"void jpgd::jpeg_decoder::make_huff_table(int, huff_tables *)");
  }
  __assert_fail("p < 258",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/3rdparty/jpeg-compressor/jpgd.cpp"
                ,0x8fb,"void jpgd::jpeg_decoder::make_huff_table(int, huff_tables *)");
}

Assistant:

void jpeg_decoder::make_huff_table(int index, huff_tables* pH)
	{
		int p, i, l, si;
		uint8 huffsize[258];
		uint huffcode[258];
		uint code;
		uint subtree;
		int code_size;
		int lastp;
		int nextfreeentry;
		int currententry;

		pH->ac_table = m_huff_ac[index] != 0;

		p = 0;

		for (l = 1; l <= 16; l++)
		{
			for (i = 1; i <= m_huff_num[index][l]; i++)
			{
				if (p >= 257)
					stop_decoding(JPGD_DECODE_ERROR);
				huffsize[p++] = static_cast<uint8>(l);
			}
		}

		assert(p < 258);
		huffsize[p] = 0;

		lastp = p;

		code = 0;
		si = huffsize[0];
		p = 0;

		while (huffsize[p])
		{
			while (huffsize[p] == si)
			{
				if (p >= 257)
					stop_decoding(JPGD_DECODE_ERROR);
				huffcode[p++] = code;
				code++;
			}

			code <<= 1;
			si++;
		}

		memset(pH->look_up, 0, sizeof(pH->look_up));
		memset(pH->look_up2, 0, sizeof(pH->look_up2));
		memset(pH->tree, 0, sizeof(pH->tree));
		memset(pH->code_size, 0, sizeof(pH->code_size));

		nextfreeentry = -1;

		p = 0;

		while (p < lastp)
		{
			i = m_huff_val[index][p];

			code = huffcode[p];
			code_size = huffsize[p];

			assert(i < JPGD_HUFF_CODE_SIZE_MAX_LENGTH);
			pH->code_size[i] = static_cast<uint8>(code_size);

			if (code_size <= 8)
			{
				code <<= (8 - code_size);

				for (l = 1 << (8 - code_size); l > 0; l--)
				{
					if (code >= 256)
						stop_decoding(JPGD_DECODE_ERROR);

					pH->look_up[code] = i;

					bool has_extrabits = false;
					int extra_bits = 0;
					int num_extra_bits = i & 15;

					int bits_to_fetch = code_size;
					if (num_extra_bits)
					{
						int total_codesize = code_size + num_extra_bits;
						if (total_codesize <= 8)
						{
							has_extrabits = true;
							extra_bits = ((1 << num_extra_bits) - 1) & (code >> (8 - total_codesize));

							if (extra_bits > 0x7FFF)
								stop_decoding(JPGD_DECODE_ERROR);

							bits_to_fetch += num_extra_bits;
						}
					}

					if (!has_extrabits)
						pH->look_up2[code] = i | (bits_to_fetch << 8);
					else
						pH->look_up2[code] = i | 0x8000 | (extra_bits << 16) | (bits_to_fetch << 8);

					code++;
				}
			}
			else
			{
				subtree = (code >> (code_size - 8)) & 0xFF;

				currententry = pH->look_up[subtree];

				if (currententry == 0)
				{
					pH->look_up[subtree] = currententry = nextfreeentry;
					pH->look_up2[subtree] = currententry = nextfreeentry;

					nextfreeentry -= 2;
				}

				code <<= (16 - (code_size - 8));

				for (l = code_size; l > 9; l--)
				{
					if ((code & 0x8000) == 0)
						currententry--;

					unsigned int idx = -currententry - 1;

					if (idx >= JPGD_HUFF_TREE_MAX_LENGTH)
						stop_decoding(JPGD_DECODE_ERROR);

					if (pH->tree[idx] == 0)
					{
						pH->tree[idx] = nextfreeentry;

						currententry = nextfreeentry;

						nextfreeentry -= 2;
					}
					else
					{
						currententry = pH->tree[idx];
					}

					code <<= 1;
				}

				if ((code & 0x8000) == 0)
					currententry--;

				if ((-currententry - 1) >= JPGD_HUFF_TREE_MAX_LENGTH)
					stop_decoding(JPGD_DECODE_ERROR);

				pH->tree[-currententry - 1] = i;
			}

			p++;
		}
	}